

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_http_thread.c
# Opt level: O3

int mk_http_thread_event(mk_event *event)

{
  _func_int_void_ptr *__pointer;
  cothread_t pvVar1;
  
  __pointer = event[2].handler;
  pthread_setspecific(mk_thread,__pointer);
  pvVar1 = co_active();
  *(cothread_t *)(__pointer + 8) = pvVar1;
  co_switch(*(cothread_t *)(__pointer + 0x10));
  return 0;
}

Assistant:

int mk_http_thread_event(struct mk_event *event)
{
    struct mk_sched_conn *conn = (struct mk_sched_conn *) event;

    /*
    struct mk_thread *th;
    struct mk_http_thread *mth;

    th = conn->channel.thread;
    mth = (struct mk_http_thread *) MK_THREAD_DATA(th);
    */

    mk_thread_resume(conn->channel.thread);
    return 0;
}